

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TreeEnsemble.pb.cc
# Opt level: O3

void __thiscall
CoreML::Specification::TreeEnsembleClassifier::MergeFrom
          (TreeEnsembleClassifier *this,TreeEnsembleClassifier *from)

{
  ulong uVar1;
  LogMessage *other;
  TreeEnsembleParameters *this_00;
  StringVector *this_01;
  Int64Vector *this_02;
  undefined1 *puVar2;
  Arena *pAVar3;
  LogFinisher local_51;
  LogMessage local_50;
  
  if (from == this) {
    google::protobuf::internal::LogMessage::LogMessage
              (&local_50,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/build_O3/mlmodel/format/TreeEnsemble.pb.cc"
               ,0x5bc);
    other = google::protobuf::internal::LogMessage::operator<<
                      (&local_50,"CHECK failed: (&from) != (this): ");
    google::protobuf::internal::LogFinisher::operator=(&local_51,other);
    google::protobuf::internal::LogMessage::~LogMessage(&local_50);
  }
  puVar2 = (undefined1 *)from->treeensemble_;
  if ((TreeEnsembleParameters *)puVar2 != (TreeEnsembleParameters *)0x0 &&
      from != (TreeEnsembleClassifier *)_TreeEnsembleClassifier_default_instance_) {
    this_00 = this->treeensemble_;
    if (this_00 == (TreeEnsembleParameters *)0x0) {
      uVar1 = (this->super_MessageLite)._internal_metadata_.ptr_;
      pAVar3 = (Arena *)(uVar1 & 0xfffffffffffffffc);
      if ((uVar1 & 1) != 0) {
        pAVar3 = *(Arena **)pAVar3;
      }
      this_00 = google::protobuf::Arena::
                CreateMaybeMessage<CoreML::Specification::TreeEnsembleParameters>(pAVar3);
      this->treeensemble_ = this_00;
      puVar2 = (undefined1 *)from->treeensemble_;
    }
    if ((TreeEnsembleParameters *)puVar2 == (TreeEnsembleParameters *)0x0) {
      puVar2 = _TreeEnsembleParameters_default_instance_;
    }
    TreeEnsembleParameters::MergeFrom(this_00,(TreeEnsembleParameters *)puVar2);
  }
  if (from->postevaluationtransform_ != 0) {
    this->postevaluationtransform_ = from->postevaluationtransform_;
  }
  if (from->_oneof_case_[0] != 0x65) {
    if (from->_oneof_case_[0] != 100) goto LAB_002c80a5;
    if (this->_oneof_case_[0] == 100) {
      this_01 = (this->ClassLabels_).stringclasslabels_;
LAB_002c804e:
      puVar2 = (undefined1 *)(from->ClassLabels_).stringclasslabels_;
    }
    else {
      clear_ClassLabels(this);
      this->_oneof_case_[0] = 100;
      uVar1 = (this->super_MessageLite)._internal_metadata_.ptr_;
      pAVar3 = (Arena *)(uVar1 & 0xfffffffffffffffc);
      if ((uVar1 & 1) != 0) {
        pAVar3 = *(Arena **)pAVar3;
      }
      this_01 = google::protobuf::Arena::CreateMaybeMessage<CoreML::Specification::StringVector>
                          (pAVar3);
      (this->ClassLabels_).stringclasslabels_ = this_01;
      if (from->_oneof_case_[0] == 100) goto LAB_002c804e;
      puVar2 = _StringVector_default_instance_;
    }
    StringVector::MergeFrom(this_01,(StringVector *)puVar2);
    goto LAB_002c80a5;
  }
  if (this->_oneof_case_[0] == 0x65) {
    this_02 = (this->ClassLabels_).int64classlabels_;
LAB_002c8085:
    puVar2 = (undefined1 *)(from->ClassLabels_).int64classlabels_;
  }
  else {
    clear_ClassLabels(this);
    this->_oneof_case_[0] = 0x65;
    uVar1 = (this->super_MessageLite)._internal_metadata_.ptr_;
    pAVar3 = (Arena *)(uVar1 & 0xfffffffffffffffc);
    if ((uVar1 & 1) != 0) {
      pAVar3 = *(Arena **)pAVar3;
    }
    this_02 = google::protobuf::Arena::CreateMaybeMessage<CoreML::Specification::Int64Vector>
                        (pAVar3);
    (this->ClassLabels_).int64classlabels_ = this_02;
    if (from->_oneof_case_[0] == 0x65) goto LAB_002c8085;
    puVar2 = _Int64Vector_default_instance_;
  }
  Int64Vector::MergeFrom(this_02,(Int64Vector *)puVar2);
LAB_002c80a5:
  uVar1 = (from->super_MessageLite)._internal_metadata_.ptr_;
  if ((uVar1 & 1) != 0) {
    google::protobuf::internal::InternalMetadata::DoMergeFrom<std::__cxx11::string>
              (&(this->super_MessageLite)._internal_metadata_,
               (string *)((uVar1 & 0xfffffffffffffffc) + 8));
  }
  return;
}

Assistant:

void TreeEnsembleClassifier::MergeFrom(const TreeEnsembleClassifier& from) {
// @@protoc_insertion_point(class_specific_merge_from_start:CoreML.Specification.TreeEnsembleClassifier)
  GOOGLE_DCHECK_NE(&from, this);
  uint32_t cached_has_bits = 0;
  (void) cached_has_bits;

  if (from._internal_has_treeensemble()) {
    _internal_mutable_treeensemble()->::CoreML::Specification::TreeEnsembleParameters::MergeFrom(from._internal_treeensemble());
  }
  if (from._internal_postevaluationtransform() != 0) {
    _internal_set_postevaluationtransform(from._internal_postevaluationtransform());
  }
  switch (from.ClassLabels_case()) {
    case kStringClassLabels: {
      _internal_mutable_stringclasslabels()->::CoreML::Specification::StringVector::MergeFrom(from._internal_stringclasslabels());
      break;
    }
    case kInt64ClassLabels: {
      _internal_mutable_int64classlabels()->::CoreML::Specification::Int64Vector::MergeFrom(from._internal_int64classlabels());
      break;
    }
    case CLASSLABELS_NOT_SET: {
      break;
    }
  }
  _internal_metadata_.MergeFrom<std::string>(from._internal_metadata_);
}